

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Float __thiscall pbrt::BilinearPatch::PDF(BilinearPatch *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  float *pfVar1;
  float *pfVar2;
  uint *puVar3;
  Point3f *s;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool bVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long in_FS_OFFSET;
  byte bVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Float FVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar64 [56];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar49 [16];
  undefined1 auVar61 [64];
  undefined1 auVar51 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined4 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Point3f PVar85;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  Point3f local_308;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  float *local_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  Tuple3<pbrt::Vector3,_float> local_2a8;
  Tuple3<pbrt::Vector3,_float> local_298;
  Tuple3<pbrt::Vector3,_float> local_288;
  Tuple3<pbrt::Vector3,_float> local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  Tuple3<pbrt::Vector3,_float> local_228;
  Tuple3<pbrt::Vector3,_float> local_218;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_178;
  char local_78;
  Tuple3<pbrt::Point3,_float> local_68;
  Ray local_58;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  
  local_2b8._8_8_ = local_2b8._0_8_;
  local_2e8._8_8_ = local_2e8._0_8_;
  auVar64 = in_ZMM0._8_56_;
  PVar85 = ShapeSampleContext::OffsetRayOrigin(ctx,wi);
  local_58.o.super_Tuple3<pbrt::Point3,_float>.z = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  auVar59._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar59._8_56_ = auVar64;
  local_58.time = *(Float *)(ctx + 0x30);
  local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar59._0_16_);
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.x = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.y = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
  local_58.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  Intersect((optional<pbrt::ShapeIntersection> *)&local_178.__align,this,&local_58,INFINITY);
  if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
     (iVar26 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)
                                    ::reg), iVar26 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)
               &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
               PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::StatsAccumulator__,
               (PixelAccumFunc)0x0);
    __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x448) = *(long *)(in_FS_OFFSET + -0x448) + 1;
  if (local_78 == '\0') {
    *(long *)(in_FS_OFFSET + -0x450) = *(long *)(in_FS_OFFSET + -0x450) + 1;
    fVar79 = 0.0;
  }
  else {
    lVar27 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
    lVar28 = (long)this->blpIndex * 0x10;
    lVar11 = *(long *)(lVar27 + 0x10);
    local_2e8._0_8_ = *(long *)(lVar27 + 0x18);
    lVar27 = (long)*(int *)(lVar11 + lVar28);
    pfVar1 = (float *)(local_2e8._0_8_ + (long)*(int *)(lVar11 + 4 + lVar28) * 0xc);
    iVar26 = *(int *)(lVar11 + 8 + lVar28);
    iVar10 = *(int *)(lVar11 + 0xc + lVar28);
    local_2d0._0_4_ =
         (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 +
         *(float *)(local_2e8._0_8_ + 8 + lVar27 * 0xc);
    auVar34 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
    auVar36._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar34._0_4_;
    auVar36._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar34._4_4_;
    auVar36._8_4_ = auVar34._8_4_ + 0.0;
    auVar36._12_4_ = auVar34._12_4_ + 0.0;
    auVar34._8_4_ = 0xbf000000;
    auVar34._0_8_ = 0xbf000000bf000000;
    auVar34._12_4_ = 0xbf000000;
    auVar34 = vmulps_avx512vl(auVar36,auVar34);
    local_2b8._0_8_ = lVar27 * 3;
    uVar6 = *(undefined8 *)(local_2e8._0_8_ + lVar27 * 0xc);
    auVar35._0_4_ = (float)uVar6 + auVar34._0_4_;
    auVar35._4_4_ = (float)((ulong)uVar6 >> 0x20) + auVar34._4_4_;
    auVar35._8_4_ = auVar34._8_4_ + 0.0;
    auVar35._12_4_ = auVar34._12_4_ + 0.0;
    auVar38._0_4_ = auVar35._0_4_ * auVar35._0_4_;
    auVar38._4_4_ = auVar35._4_4_ * auVar35._4_4_;
    auVar38._8_4_ = auVar35._8_4_ * auVar35._8_4_;
    auVar38._12_4_ = auVar35._12_4_ * auVar35._12_4_;
    auVar34 = vmovshdup_avx(auVar38);
    auVar34 = vfmadd231ss_fma(auVar34,auVar35,auVar35);
    auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)local_2d0._0_4_),ZEXT416((uint)local_2d0._0_4_))
    ;
    if (auVar34._0_4_ < 0.0) {
      local_2f8 = auVar35;
      local_278.z = sqrtf(auVar34._0_4_);
      auVar35 = local_2f8;
    }
    else {
      auVar34 = vsqrtss_avx(auVar34,auVar34);
      local_278.z = auVar34._0_4_;
    }
    pfVar2 = (float *)(local_2e8._0_8_ + (long)iVar26 * 0xc);
    auVar66._4_4_ = local_278.z;
    auVar66._0_4_ = local_278.z;
    auVar66._8_4_ = local_278.z;
    auVar66._12_4_ = local_278.z;
    auVar34 = vdivps_avx(auVar35,auVar66);
    local_278.z = local_2d0._0_4_ / local_278.z;
    local_278._0_8_ = vmovlps_avx(auVar34);
    local_288.z = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 + pfVar1[2];
    auVar34 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
    auVar42._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar34._0_4_;
    auVar42._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar34._4_4_;
    auVar42._8_4_ = auVar34._8_4_ + 0.0;
    auVar42._12_4_ = auVar34._12_4_ + 0.0;
    auVar37._8_4_ = 0xbf000000;
    auVar37._0_8_ = 0xbf000000bf000000;
    auVar37._12_4_ = 0xbf000000;
    auVar34 = vmulps_avx512vl(auVar42,auVar37);
    auVar39._0_4_ = (float)*(undefined8 *)pfVar1 + auVar34._0_4_;
    auVar39._4_4_ = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20) + auVar34._4_4_;
    auVar39._8_4_ = auVar34._8_4_ + 0.0;
    auVar39._12_4_ = auVar34._12_4_ + 0.0;
    auVar43._0_4_ = auVar39._0_4_ * auVar39._0_4_;
    auVar43._4_4_ = auVar39._4_4_ * auVar39._4_4_;
    auVar43._8_4_ = auVar39._8_4_ * auVar39._8_4_;
    auVar43._12_4_ = auVar39._12_4_ * auVar39._12_4_;
    auVar34 = vmovshdup_avx(auVar43);
    auVar34 = vfmadd231ss_fma(auVar34,auVar39,auVar39);
    auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)local_288.z),ZEXT416((uint)local_288.z));
    local_2d0 = pfVar1;
    if (auVar34._0_4_ < 0.0) {
      local_2f8._0_4_ = local_288.z;
      local_2c8 = auVar39;
      fVar79 = sqrtf(auVar34._0_4_);
      local_288.z = (float)local_2f8._0_4_;
      auVar39 = local_2c8;
    }
    else {
      auVar34 = vsqrtss_avx(auVar34,auVar34);
      fVar79 = auVar34._0_4_;
    }
    puVar3 = (uint *)(local_2e8._0_8_ + (long)iVar10 * 0xc);
    auVar67._4_4_ = fVar79;
    auVar67._0_4_ = fVar79;
    auVar67._8_4_ = fVar79;
    auVar67._12_4_ = fVar79;
    auVar34 = vdivps_avx(auVar39,auVar67);
    local_288.z = local_288.z / fVar79;
    local_288._0_8_ = vmovlps_avx(auVar34);
    local_298.z = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 + pfVar2[2];
    auVar34 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
    auVar44._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar34._0_4_;
    auVar44._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar34._4_4_;
    auVar44._8_4_ = auVar34._8_4_ + 0.0;
    auVar44._12_4_ = auVar34._12_4_ + 0.0;
    auVar13._8_4_ = 0xbf000000;
    auVar13._0_8_ = 0xbf000000bf000000;
    auVar13._12_4_ = 0xbf000000;
    auVar34 = vmulps_avx512vl(auVar44,auVar13);
    auVar81._0_4_ = (float)*(undefined8 *)pfVar2 + auVar34._0_4_;
    auVar81._4_4_ = (float)((ulong)*(undefined8 *)pfVar2 >> 0x20) + auVar34._4_4_;
    auVar81._8_4_ = auVar34._8_4_ + 0.0;
    auVar81._12_4_ = auVar34._12_4_ + 0.0;
    auVar45._0_4_ = auVar81._0_4_ * auVar81._0_4_;
    auVar45._4_4_ = auVar81._4_4_ * auVar81._4_4_;
    auVar45._8_4_ = auVar81._8_4_ * auVar81._8_4_;
    auVar45._12_4_ = auVar81._12_4_ * auVar81._12_4_;
    auVar34 = vmovshdup_avx(auVar45);
    auVar34 = vfmadd231ss_fma(auVar34,auVar81,auVar81);
    auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)local_298.z),ZEXT416((uint)local_298.z));
    if (auVar34._0_4_ < 0.0) {
      local_2f8._0_4_ = local_298.z;
      local_2c8 = auVar81;
      fVar79 = sqrtf(auVar34._0_4_);
      local_298.z = (float)local_2f8._0_4_;
      auVar81 = local_2c8;
    }
    else {
      auVar34 = vsqrtss_avx(auVar34,auVar34);
      fVar79 = auVar34._0_4_;
    }
    auVar68._4_4_ = fVar79;
    auVar68._0_4_ = fVar79;
    auVar68._8_4_ = fVar79;
    auVar68._12_4_ = fVar79;
    auVar34 = vdivps_avx(auVar81,auVar68);
    local_298.z = local_298.z / fVar79;
    local_298._0_8_ = vmovlps_avx(auVar34);
    local_2a8.z = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 + (float)puVar3[2];
    auVar34 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
    auVar46._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar34._0_4_;
    auVar46._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar34._4_4_;
    auVar46._8_4_ = auVar34._8_4_ + 0.0;
    auVar46._12_4_ = auVar34._12_4_ + 0.0;
    auVar14._8_4_ = 0xbf000000;
    auVar14._0_8_ = 0xbf000000bf000000;
    auVar14._12_4_ = 0xbf000000;
    auVar34 = vmulps_avx512vl(auVar46,auVar14);
    auVar82._0_4_ = (float)*(undefined8 *)puVar3 + auVar34._0_4_;
    auVar82._4_4_ = (float)((ulong)*(undefined8 *)puVar3 >> 0x20) + auVar34._4_4_;
    auVar82._8_4_ = auVar34._8_4_ + 0.0;
    auVar82._12_4_ = auVar34._12_4_ + 0.0;
    auVar47._0_4_ = auVar82._0_4_ * auVar82._0_4_;
    auVar47._4_4_ = auVar82._4_4_ * auVar82._4_4_;
    auVar47._8_4_ = auVar82._8_4_ * auVar82._8_4_;
    auVar47._12_4_ = auVar82._12_4_ * auVar82._12_4_;
    auVar34 = vmovshdup_avx(auVar47);
    auVar34 = vfmadd231ss_fma(auVar34,auVar82,auVar82);
    auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)local_2a8.z),ZEXT416((uint)local_2a8.z));
    if (auVar34._0_4_ < 0.0) {
      local_2f8._0_4_ = local_2a8.z;
      local_2c8 = auVar82;
      fVar79 = sqrtf(auVar34._0_4_);
      local_2a8.z = (float)local_2f8._0_4_;
      auVar82 = local_2c8;
    }
    else {
      auVar34 = vsqrtss_avx(auVar34,auVar34);
      fVar79 = auVar34._0_4_;
    }
    auVar69._4_4_ = fVar79;
    auVar69._0_4_ = fVar79;
    auVar69._8_4_ = fVar79;
    auVar69._12_4_ = fVar79;
    auVar34 = vdivps_avx(auVar82,auVar69);
    local_2a8.z = local_2a8.z / fVar79;
    local_2a8._0_8_ = vmovlps_avx(auVar34);
    bVar25 = IsRectangle(this);
    if (((!bVar25) ||
        (*(long *)(*(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8) + 0x38) != 0)) ||
       (FVar40 = SphericalQuadArea((Vector3f *)&local_278,(Vector3f *)&local_288,
                                   (Vector3f *)&local_2a8,(Vector3f *)&local_298), FVar40 <= 0.0001)
       ) {
      if ((local_78 != '\x01') ||
         (FVar40 = PDF(this,(Interaction *)&local_178.__align), local_78 == '\0')) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
      }
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      auVar35 = ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).z);
      auVar34 = vxorps_avx512vl(auVar35,auVar22);
      auVar36 = ZEXT416((uint)((float)local_178._48_4_ * auVar34._0_4_));
      auVar34 = vfnmadd132ss_fma(ZEXT416((uint)local_178._44_4_),auVar36,
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).y));
      auVar35 = vfnmsub213ss_fma(auVar35,ZEXT416((uint)local_178._48_4_),auVar36);
      auVar34 = vfnmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_)),
                                 ZEXT416((uint)local_178._40_4_),
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).x));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar35 = vandps_avx512vl(auVar34,auVar23);
      fVar79 = (*(float *)(ctx + 8) + *(float *)(ctx + 0xc)) * 0.5 -
               ((float)local_178._8_4_ + (float)local_178._12_4_) * 0.5;
      auVar34 = ZEXT416((uint)((*(float *)ctx + *(float *)(ctx + 4)) * 0.5 -
                              ((float)local_178._0_4_ + (float)local_178._4_4_) * 0.5));
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar79 * fVar79)),auVar34,auVar34);
      auVar36 = ZEXT416((uint)((*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5 -
                              ((float)local_178._16_4_ + (float)local_178._20_4_) * 0.5));
      auVar34 = vfmadd231ss_fma(auVar34,auVar36,auVar36);
      fVar79 = FVar40 / (auVar35._0_4_ / auVar34._0_4_);
      fVar79 = (float)((uint)(ABS(fVar79) != INFINITY) * (int)fVar79);
    }
    else {
      FVar40 = SphericalQuadArea((Vector3f *)&local_278,(Vector3f *)&local_288,
                                 (Vector3f *)&local_2a8,(Vector3f *)&local_298);
      fVar79 = 1.0 / FVar40;
      local_188 = ZEXT416((uint)fVar79);
      if (((*(float *)(ctx + 0x24) != 0.0) || (*(float *)(ctx + 0x28) != 0.0)) ||
         ((NAN(*(float *)(ctx + 0x28)) ||
          ((*(float *)(ctx + 0x2c) != 0.0 || (NAN(*(float *)(ctx + 0x2c)))))))) {
        s = (Point3f *)(local_2e8._0_8_ + local_2b8._0_8_ * 4);
        auVar34 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
        auVar48._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar34._0_4_;
        auVar48._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar34._4_4_;
        auVar48._8_4_ = auVar34._8_4_ + 0.0;
        auVar48._12_4_ = auVar34._12_4_ + 0.0;
        auVar15._8_4_ = 0x3f000000;
        auVar15._0_8_ = 0x3f0000003f000000;
        auVar15._12_4_ = 0x3f000000;
        auVar34 = vmulps_avx512vl(auVar48,auVar15);
        local_308.super_Tuple3<pbrt::Point3,_float>.z =
             (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
        uVar6 = vmovlps_avx(auVar34);
        local_308.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar6;
        local_308.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar6 >> 0x20);
        fVar79 = (s->super_Tuple3<pbrt::Point3,_float>).y -
                 local_308.super_Tuple3<pbrt::Point3,_float>.y;
        fVar41 = (s->super_Tuple3<pbrt::Point3,_float>).z -
                 local_308.super_Tuple3<pbrt::Point3,_float>.z;
        fVar65 = (s->super_Tuple3<pbrt::Point3,_float>).x -
                 local_308.super_Tuple3<pbrt::Point3,_float>.x;
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar79 * fVar79)),ZEXT416((uint)fVar65),
                                  ZEXT416((uint)fVar65));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
        local_2b8 = ZEXT416((uint)fVar65);
        if (auVar34._0_4_ < 0.0) {
          local_2e8._0_4_ = fVar79;
          local_2f8._0_4_ = fVar41;
          auVar60._0_4_ = sqrtf(auVar34._0_4_);
          auVar60._4_60_ = extraout_var;
          local_2c8 = auVar60._0_16_;
        }
        else {
          local_2c8 = vsqrtss_avx(auVar34,auVar34);
          local_2f8._0_4_ = fVar41;
          local_2e8._0_4_ = fVar79;
        }
        fVar79 = (float)local_2e8._0_4_ / local_2c8._0_4_;
        local_2f8._0_4_ = (float)local_2f8._0_4_ / local_2c8._0_4_;
        local_2e8 = ZEXT416((uint)local_2f8._0_4_);
        local_268._0_4_ = (float)local_2f8._0_4_ * *(float *)(ctx + 0x2c);
        local_2f8 = vfmadd132ss_fma(ZEXT416((uint)fVar79),ZEXT416((uint)local_268._0_4_),
                                    ZEXT416(*(uint *)(ctx + 0x28)));
        fVar79 = *local_2d0 - local_308.super_Tuple3<pbrt::Point3,_float>.x;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)(local_2d0 + 1);
        auVar70._4_4_ = local_308.super_Tuple3<pbrt::Point3,_float>.z;
        auVar70._0_4_ = local_308.super_Tuple3<pbrt::Point3,_float>.y;
        auVar70._8_8_ = 0;
        local_248 = vsubps_avx(auVar49,auVar70);
        auVar34 = vmovshdup_avx(local_248);
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_248._0_4_ * local_248._0_4_)),
                                  ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
        auVar34 = vfmadd231ss_fma(auVar35,auVar34,auVar34);
        local_1b8 = ZEXT416(*(uint *)(ctx + 0x24));
        local_1c8 = ZEXT416((uint)fVar79);
        local_258._0_4_ = *(float *)(ctx + 0x2c);
        if (auVar34._0_4_ < 0.0) {
          auVar61._0_4_ = sqrtf(auVar34._0_4_);
          auVar61._4_60_ = extraout_var_00;
          local_1d8 = auVar61._0_16_;
        }
        else {
          local_1d8 = vsqrtss_avx(auVar34,auVar34);
        }
        uVar80 = local_1d8._0_4_;
        auVar50._4_4_ = uVar80;
        auVar50._0_4_ = uVar80;
        auVar50._8_4_ = uVar80;
        auVar50._12_4_ = uVar80;
        auVar34 = vdivps_avx(local_248,auVar50);
        uVar7 = *(ulong *)(ctx + 0x28);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar7;
        auVar77._0_4_ = auVar34._0_4_ * (float)uVar7;
        auVar77._4_4_ = auVar34._4_4_ * (float)(uVar7 >> 0x20);
        auVar77._8_4_ = auVar34._8_4_ * 0.0;
        auVar77._12_4_ = auVar34._12_4_ * 0.0;
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar35 = vxorps_avx512vl(auVar77,auVar16);
        auVar35 = vpermt2ps_avx512vl(auVar77,_DAT_00462ba0,auVar35);
        local_248 = vfmadd231ps_fma(auVar35,auVar71,auVar34);
        local_1e8 = vmovshdup_avx(local_248);
        fVar79 = *pfVar2 - local_308.super_Tuple3<pbrt::Point3,_float>.x;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(pfVar2 + 1);
        auVar72._4_4_ = local_308.super_Tuple3<pbrt::Point3,_float>.z;
        auVar72._0_4_ = local_308.super_Tuple3<pbrt::Point3,_float>.y;
        auVar72._8_8_ = 0;
        auVar35 = vsubps_avx(auVar51,auVar72);
        auVar34 = vmovshdup_avx(auVar35);
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * auVar35._0_4_)),
                                  ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
        auVar34 = vfmadd231ss_fma(auVar36,auVar34,auVar34);
        local_1f8 = ZEXT416(*(uint *)(ctx + 0x24));
        local_208 = ZEXT416((uint)fVar79);
        if (auVar34._0_4_ < 0.0) {
          local_238 = auVar35;
          auVar62._0_4_ = sqrtf(auVar34._0_4_);
          auVar62._4_60_ = extraout_var_01;
          auVar34 = auVar62._0_16_;
          auVar35 = local_238;
        }
        else {
          auVar34 = vsqrtss_avx(auVar34,auVar34);
        }
        local_2e8 = vfmsub213ss_fma(local_2e8,ZEXT416((uint)local_258._0_4_),
                                    ZEXT416((uint)local_268._0_4_));
        uVar80 = auVar34._0_4_;
        auVar52._4_4_ = uVar80;
        auVar52._0_4_ = uVar80;
        auVar52._8_4_ = uVar80;
        auVar52._12_4_ = uVar80;
        auVar35 = vdivps_avx(auVar35,auVar52);
        uVar7 = *(ulong *)(ctx + 0x28);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = uVar7;
        auVar84._0_4_ = auVar35._0_4_ * (float)uVar7;
        auVar84._4_4_ = auVar35._4_4_ * (float)(uVar7 >> 0x20);
        auVar84._8_4_ = auVar35._8_4_ * 0.0;
        auVar84._12_4_ = auVar35._12_4_ * 0.0;
        auVar17._8_4_ = 0x80000000;
        auVar17._0_8_ = 0x8000000080000000;
        auVar17._12_4_ = 0x80000000;
        auVar36 = vxorps_avx512vl(auVar84,auVar17);
        auVar36 = vpermt2ps_avx512vl(auVar84,_DAT_00462ba0,auVar36);
        auVar35 = vfmadd231ps_fma(auVar36,auVar73,auVar35);
        auVar37 = vsubss_avx512f(ZEXT416(*puVar3),
                                 ZEXT416((uint)local_308.super_Tuple3<pbrt::Point3,_float>.x));
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(puVar3 + 1);
        auVar74._4_4_ = local_308.super_Tuple3<pbrt::Point3,_float>.z;
        auVar74._0_4_ = local_308.super_Tuple3<pbrt::Point3,_float>.y;
        auVar74._8_8_ = 0;
        auVar38 = vsubps_avx512vl(auVar53,auVar74);
        auVar36 = vmovshdup_avx512vl(auVar38);
        auVar39 = vmulss_avx512f(auVar38,auVar38);
        auVar39 = vfmadd231ss_avx512f(auVar39,auVar37,auVar37);
        auVar36 = vfmadd231ss_fma(auVar39,auVar36,auVar36);
        if (auVar36._0_4_ < 0.0) {
          local_238 = ZEXT416(*(uint *)(ctx + 0x24));
          local_268 = auVar34;
          local_258 = auVar35;
          local_1a8 = auVar37;
          local_198 = auVar38;
          fVar79 = sqrtf(auVar36._0_4_);
          auVar38 = local_198;
          auVar37 = local_1a8;
          auVar34 = local_268;
          auVar36 = local_238;
          auVar35 = local_258;
        }
        else {
          auVar36 = vsqrtss_avx(auVar36,auVar36);
          fVar79 = auVar36._0_4_;
          auVar36 = ZEXT416(*(uint *)(ctx + 0x24));
        }
        auVar37 = vinsertps_avx512f(auVar37,local_208,0x10);
        auVar37 = vinsertps_avx(auVar37,local_1c8,0x20);
        auVar37 = vinsertps_avx(auVar37,local_2b8,0x30);
        auVar54._4_4_ = fVar79;
        auVar54._0_4_ = fVar79;
        auVar54._8_4_ = fVar79;
        auVar54._12_4_ = fVar79;
        auVar34 = vinsertps_avx(auVar54,auVar34,0x10);
        auVar34 = vinsertps_avx(auVar34,local_1d8,0x20);
        auVar34 = vinsertps_avx(auVar34,local_2c8,0x30);
        auVar34 = vdivps_avx(auVar37,auVar34);
        auVar38 = vdivps_avx512vl(auVar38,auVar54);
        auVar36 = vinsertps_avx(*(undefined1 (*) [16])(ctx + 0x24),auVar36,0x10);
        auVar36 = vinsertps_avx(auVar36,local_1f8,0x20);
        auVar36 = vinsertps_avx(auVar36,local_1b8,0x30);
        uVar7 = *(ulong *)(ctx + 0x28);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar7;
        auVar83._0_4_ = auVar38._0_4_ * (float)uVar7;
        auVar83._4_4_ = auVar38._4_4_ * (float)(uVar7 >> 0x20);
        auVar83._8_4_ = auVar38._8_4_ * 0.0;
        auVar83._12_4_ = auVar38._12_4_ * 0.0;
        auVar18._8_4_ = 0x80000000;
        auVar18._0_8_ = 0x8000000080000000;
        auVar18._12_4_ = 0x80000000;
        auVar37 = vxorps_avx512vl(auVar83,auVar18);
        auVar37 = vpermi2ps_avx512vl(_DAT_00462ba0,auVar83,auVar37);
        auVar37 = vfmadd231ps_fma(auVar37,auVar78,auVar38);
        auVar38 = vunpcklps_avx(auVar37,auVar35);
        auVar38 = vinsertps_avx(auVar38,local_248,0x20);
        auVar38 = vinsertps_avx(auVar38,local_2f8,0x30);
        auVar35 = vinsertps_avx(auVar35,auVar37,0x4c);
        auVar35 = vinsertps_avx(auVar35,local_1e8,0x20);
        auVar35 = vinsertps_avx(auVar35,local_2e8,0x30);
        auVar55._0_4_ = auVar38._0_4_ + auVar35._0_4_;
        auVar55._4_4_ = auVar38._4_4_ + auVar35._4_4_;
        auVar55._8_4_ = auVar38._8_4_ + auVar35._8_4_;
        auVar55._12_4_ = auVar38._12_4_ + auVar35._12_4_;
        auVar34 = vfmadd231ps_fma(auVar55,auVar34,auVar36);
        auVar19._8_4_ = 0x7fffffff;
        auVar19._0_8_ = 0x7fffffff7fffffff;
        auVar19._12_4_ = 0x7fffffff;
        local_2e8 = vandps_avx512vl(auVar34,auVar19);
        auVar20._8_4_ = 0x3c23d70a;
        auVar20._0_8_ = 0x3c23d70a3c23d70a;
        auVar20._12_4_ = 0x3c23d70a;
        uVar6 = vcmpps_avx512vl(local_2e8,auVar20,0xe);
        local_2b8._0_2_ = (short)uVar6;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)local_2d0;
        uVar4 = (s->super_Tuple3<pbrt::Point3,_float>).x;
        uVar8 = (s->super_Tuple3<pbrt::Point3,_float>).y;
        auVar75._4_4_ = uVar8;
        auVar75._0_4_ = uVar4;
        auVar75._8_8_ = 0;
        auVar34 = vsubps_avx(auVar56,auVar75);
        local_218.z = local_2d0[2] - (s->super_Tuple3<pbrt::Point3,_float>).z;
        local_218._0_8_ = vmovlps_avx(auVar34);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)pfVar2;
        uVar5 = (s->super_Tuple3<pbrt::Point3,_float>).x;
        uVar9 = (s->super_Tuple3<pbrt::Point3,_float>).y;
        auVar76._4_4_ = uVar9;
        auVar76._0_4_ = uVar5;
        auVar76._8_8_ = 0;
        auVar34 = vsubps_avx(auVar57,auVar76);
        local_228.z = pfVar2[2] - (s->super_Tuple3<pbrt::Point3,_float>).z;
        local_228._0_8_ = vmovlps_avx(auVar34);
        if (local_78 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        auVar24._4_4_ = local_178._4_4_;
        auVar24._0_4_ = local_178._0_4_;
        auVar24._8_4_ = local_178._8_4_;
        auVar24._12_4_ = local_178._12_4_;
        auVar34 = vinsertps_avx(auVar24,ZEXT416((uint)local_178._12_4_),0x10);
        auVar58._0_4_ = (float)local_178._4_4_ + auVar34._0_4_;
        auVar58._4_4_ = (float)local_178._8_4_ + auVar34._4_4_;
        auVar58._8_4_ = auVar34._8_4_ + 0.0;
        auVar58._12_4_ = auVar34._12_4_ + 0.0;
        auVar21._8_4_ = 0x3f000000;
        auVar21._0_8_ = 0x3f0000003f000000;
        auVar21._12_4_ = 0x3f000000;
        auVar34 = vmulps_avx512vl(auVar58,auVar21);
        local_68.z = ((float)local_178._16_4_ + (float)local_178._20_4_) * 0.5;
        local_68._0_8_ = vmovlps_avx(auVar34);
        auVar63._0_8_ =
             InvertSphericalRectangleSample
                       (&local_308,s,(Vector3f *)&local_218,(Vector3f *)&local_228,
                        (Point3f *)&local_68);
        auVar63._8_56_ = extraout_var_02;
        fVar79 = 0.0;
        fVar41 = auVar63._0_4_;
        if ((0.0 <= fVar41) && (fVar41 <= 1.0)) {
          auVar34 = vmovshdup_avx(auVar63._0_16_);
          fVar65 = auVar34._0_4_;
          if ((0.0 <= fVar65) && (fVar65 <= 1.0)) {
            bVar29 = local_2b8[0];
            auVar34 = vshufps_avx(local_2e8,local_2e8,0xff);
            fVar30 = (float)((uint)(bVar29 >> 3 & 1) * auVar34._0_4_ +
                            (uint)!(bool)(bVar29 >> 3 & 1) * 0x3c23d70a);
            auVar34 = vshufps_avx(local_2e8,local_2e8,0x4e);
            fVar31 = (float)((uint)(bVar29 >> 2 & 1) * auVar34._0_4_ +
                            (uint)!(bool)(bVar29 >> 2 & 1) * 0x3c23d70a);
            auVar34 = vshufps_avx(local_2e8,local_2e8,0xf5);
            fVar32 = (float)((uint)(bVar29 >> 1 & 1) * auVar34._0_4_ +
                            (uint)!(bool)(bVar29 >> 1 & 1) * 0x3c23d70a);
            fVar33 = (float)((uint)(bVar29 & 1) * local_2e8._0_4_ +
                            (uint)!(bool)(bVar29 & 1) * 0x3c23d70a);
            fVar12 = fVar30 + fVar31 + fVar32 + fVar33;
            fVar79 = 1.0;
            if ((fVar12 != 0.0) || (NAN(fVar12))) {
              auVar34 = vfmadd213ss_fma(ZEXT416((uint)fVar30),
                                        ZEXT416((uint)((1.0 - fVar41) * (1.0 - fVar65))),
                                        ZEXT416((uint)(fVar41 * (1.0 - fVar65) * fVar31)));
              auVar34 = vfmadd213ss_fma(ZEXT416((uint)fVar32),
                                        ZEXT416((uint)((1.0 - fVar41) * fVar65)),auVar34);
              auVar34 = vfmadd213ss_fma(ZEXT416((uint)fVar33),ZEXT416((uint)(fVar41 * fVar65)),
                                        auVar34);
              fVar79 = (auVar34._0_4_ * 4.0) / fVar12;
            }
          }
        }
        fVar79 = (float)local_188._0_4_ * fVar79;
      }
    }
  }
  return fVar79;
}

Assistant:

Float BilinearPatch::PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
    // Intersect sample ray with shape geometry
    Ray ray = ctx.SpawnRay(wi);
    pstd::optional<ShapeIntersection> isect = Intersect(ray);
    CHECK_RARE(1e-6, !isect.has_value());
    if (!isect)
        return 0;

    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !GetMesh()->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Return PDF for sample in spherical rectangle
        Float pdf = 1 / SphericalQuadArea(v00, v10, v11, v01);
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            Point2f u = InvertSphericalRectangleSample(rp, p00, p10 - p00, p01 - p00,
                                                       isect->intr.p());
            return BilinearPDF(u, w) * pdf;
        } else
            return pdf;

    } else {
        // Return solid angle PDF for sampling bilinear patch at _intr_
        Float pdf = PDF(isect->intr) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;
        return pdf;
    }
}